

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O3

void Pln_ManPrintFinal(Pln_Man_t *p,int fVerbose,int fVeryVerbose)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Hsh_VecMan_t *pHVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(400);
  p_00->pArray = piVar9;
  pVVar10 = p->vCoefs;
  if (pVVar10->nSize < 1) {
    iVar12 = 0;
  }
  else {
    lVar13 = 0;
    do {
      uVar2 = pVVar10->pArray[lVar13];
      if ((ulong)uVar2 != 0) {
        if ((int)uVar2 < 0) goto LAB_0068336c;
        pHVar5 = p->pHashC;
        if (pHVar5->vMap->nSize <= (int)uVar2) goto LAB_0068336c;
        iVar12 = pHVar5->vMap->pArray[uVar2];
        if (((long)iVar12 < 0) || (pHVar5->vData->nSize <= iVar12)) goto LAB_0068338b;
        piVar9 = pHVar5->vData->pArray + iVar12;
        iVar12 = *piVar9;
        (pHVar5->vTemp).nCap = iVar12;
        (pHVar5->vTemp).nSize = iVar12;
        (pHVar5->vTemp).pArray = piVar9 + 2;
        if (iVar12 < 1) goto LAB_0068336c;
        Vec_IntPush(p_00,piVar9[2]);
        pHVar5 = p->pHashM;
        if (pHVar5->vMap->nSize <= lVar13) goto LAB_0068336c;
        iVar12 = pHVar5->vMap->pArray[lVar13];
        if (((long)iVar12 < 0) || (pHVar5->vData->nSize <= iVar12)) goto LAB_0068338b;
        piVar9 = pHVar5->vData->pArray + iVar12;
        iVar12 = *piVar9;
        (pHVar5->vTemp).nCap = iVar12;
        (pHVar5->vTemp).nSize = iVar12;
        (pHVar5->vTemp).pArray = piVar9 + 2;
        if (iVar12 == 0) {
          iVar12 = 0;
        }
        else {
          if (iVar12 < 1) goto LAB_0068336c;
          iVar12 = piVar9[2];
        }
        Vec_IntPush(p_00,iVar12);
        Vec_IntPush(p_00,uVar2);
        Vec_IntPush(p_00,(int)lVar13);
        pVVar10 = p->vCoefs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar10->nSize);
    piVar9 = p_00->pArray;
    iVar12 = p_00->nSize;
  }
  iVar8 = iVar12 + 3;
  if (-1 < iVar12) {
    iVar8 = iVar12;
  }
  qsort(piVar9,(long)(iVar8 >> 2),0x10,Pln_ManCompare3);
  if (1 < iVar12 && fVerbose != 0) {
    uVar11 = 0;
    do {
      if ((uVar11 & 2) != 0) {
        uVar2 = piVar9[uVar11];
        uVar3 = piVar9[uVar11 + 1];
        printf("%-6d : ",uVar11 >> 2 & 0x3fffffff);
        if ((int)uVar2 < 0) {
LAB_0068336c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pHVar5 = p->pHashC;
        if (pHVar5->vMap->nSize <= (int)uVar2) goto LAB_0068336c;
        iVar4 = pHVar5->vMap->pArray[uVar2];
        if (((long)iVar4 < 0) || (pHVar5->vData->nSize <= iVar4)) {
LAB_0068338b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar1 = pHVar5->vData->pArray + iVar4;
        iVar4 = *piVar1;
        (pHVar5->vTemp).nCap = iVar4;
        (pHVar5->vTemp).nSize = iVar4;
        (pHVar5->vTemp).pArray = piVar1 + 2;
        if (0 < iVar4) {
          lVar13 = 0;
          do {
            iVar4 = (pHVar5->vTemp).pArray[lVar13];
            pcVar7 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
            if (iVar4 < 0) {
              pcVar7 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -"
              ;
            }
            iVar6 = -iVar4;
            if (0 < iVar4) {
              iVar6 = iVar4;
            }
            printf("%s%d",pcVar7 + 0x4a,(ulong)(uint)(1 << ((char)iVar6 - 1U & 0x1f)));
            lVar13 = lVar13 + 1;
          } while (lVar13 < (pHVar5->vTemp).nSize);
        }
        if ((int)uVar3 < 0) goto LAB_0068336c;
        pHVar5 = p->pHashM;
        if (pHVar5->vMap->nSize <= (int)uVar3) goto LAB_0068336c;
        iVar4 = pHVar5->vMap->pArray[uVar3];
        if (((long)iVar4 < 0) || (pHVar5->vData->nSize <= iVar4)) goto LAB_0068338b;
        piVar1 = pHVar5->vData->pArray + iVar4;
        iVar4 = *piVar1;
        (pHVar5->vTemp).nCap = iVar4;
        (pHVar5->vTemp).nSize = iVar4;
        (pHVar5->vTemp).pArray = piVar1 + 2;
        if (0 < iVar4) {
          lVar13 = 0;
          do {
            printf(" * %d",(ulong)(uint)(pHVar5->vTemp).pArray[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 < (pHVar5->vTemp).nSize);
        }
        putchar(10);
      }
      uVar11 = uVar11 + 2;
    } while ((int)((uint)uVar11 | 1) < iVar12);
  }
  printf("HashC = %d. HashM = %d.  Total = %d. Used = %d.  ",(ulong)(uint)p->pHashC->vMap->nSize,
         (ulong)(uint)p->pHashM->vMap->nSize,(ulong)(uint)p->nBuilds,(ulong)(uint)(iVar8 >> 2));
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(p_00);
  return;
}

Assistant:

void Pln_ManPrintFinal( Pln_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vArray;
    int i, k, Entry, iMono, iConst;
    // collect triples
    Vec_Int_t * vPairs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( p->vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntPush( vPairs, Vec_IntEntry(vArray, 0) );
        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntPush( vPairs, Vec_IntSize(vArray) ? Vec_IntEntry(vArray, 0) : 0 );
        Vec_IntPushTwo( vPairs, iConst, iMono );
    }
    // sort triples
    qsort( Vec_IntArray(vPairs), (size_t)(Vec_IntSize(vPairs)/4), 16, (int (*)(const void *, const void *))Pln_ManCompare3 );
    // print
    if ( fVerbose )
    Vec_IntForEachEntryDouble( vPairs, iConst, iMono, i )
    {
        if ( i % 4 == 0 )
            continue;
        printf( "%-6d : ", i/4 );
        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( "%s%d", Entry < 0 ? "-" : "+", (1 << (Abc_AbsInt(Entry)-1)) );
        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( " * %d", Entry );
        printf( "\n" );
    }
    printf( "HashC = %d. HashM = %d.  Total = %d. Used = %d.  ", Hsh_VecSize(p->pHashC), Hsh_VecSize(p->pHashM), p->nBuilds, Vec_IntSize(vPairs)/4 );
    Vec_IntFree( vPairs );
}